

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

char ** Map_CloneVector(char **source,size_t count)

{
  int iVar1;
  ulong local_30;
  size_t j;
  size_t i;
  char **result;
  size_t count_local;
  char **source_local;
  
  i = (size_t)malloc(count << 3);
  if ((void *)i != (void *)0x0) {
    j = 0;
    while ((j < count && (iVar1 = mallocAndStrcpy_s((char **)(i + j * 8),source[j]), iVar1 == 0))) {
      j = j + 1;
    }
    if (j != count) {
      for (local_30 = 0; local_30 < j; local_30 = local_30 + 1) {
        free(*(void **)(i + local_30 * 8));
      }
      free((void *)i);
      i = 0;
    }
  }
  return (char **)i;
}

Assistant:

static char** Map_CloneVector(const char*const * source, size_t count)
{
    char** result;
    result = (char**)malloc(count *sizeof(char*));
    if (result == NULL)
    {
        /*do nothing, just return it (NULL)*/
    }
    else
    {
        size_t i;
        for (i = 0; i < count; i++)
        {
            if (mallocAndStrcpy_s(result + i, source[i]) != 0)
            {
                break;
            }
        }

        if (i == count)
        {
            /*it is all good, proceed to return result*/
        }
        else
        {
            size_t j;
            for (j = 0; j < i; j++)
            {
                free(result[j]);
            }
            free(result);
            result = NULL;
        }
    }
    return result;
}